

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sig_agg
              (secp256k1_context *ctx,uchar *sig64,secp256k1_musig_session *session,
              secp256k1_musig_partial_sig **partial_sigs,size_t n_sigs)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  ulong in_R8;
  secp256k1_scalar term;
  secp256k1_musig_session_internal session_i;
  size_t i;
  secp256k1_musig_session *in_stack_ffffffffffffff18;
  secp256k1_musig_session_internal *in_stack_ffffffffffffff20;
  secp256k1_context *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uStack_a8;
  undefined8 local_a4;
  ulong local_38;
  int local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_musig_session_load
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                      );
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      for (local_38 = 0; local_38 < in_R8; local_38 = local_38 + 1) {
        iVar1 = secp256k1_musig_partial_sig_load
                          (in_stack_ffffffffffffff28,(secp256k1_scalar *)in_stack_ffffffffffffff20,
                           (secp256k1_musig_partial_sig *)in_stack_ffffffffffffff18);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_scalar_add
                  ((secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                   ,(secp256k1_scalar *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                  );
      }
      secp256k1_scalar_get_b32
                ((uchar *)in_stack_ffffffffffffff20,(secp256k1_scalar *)in_stack_ffffffffffffff18);
      *in_RSI = CONCAT44(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      in_RSI[1] = CONCAT44(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      in_RSI[2] = CONCAT44(uStack_a8,in_stack_ffffffffffffff54);
      in_RSI[3] = local_a4;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_partial_sig_agg(const secp256k1_context* ctx, unsigned char *sig64, const secp256k1_musig_session *session, const secp256k1_musig_partial_sig * const* partial_sigs, size_t n_sigs) {
    size_t i;
    secp256k1_musig_session_internal session_i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(partial_sigs != NULL);
    ARG_CHECK(n_sigs > 0);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }
    for (i = 0; i < n_sigs; i++) {
        secp256k1_scalar term;
        if (!secp256k1_musig_partial_sig_load(ctx, &term, partial_sigs[i])) {
            return 0;
        }
        secp256k1_scalar_add(&session_i.s_part, &session_i.s_part, &term);
    }
    secp256k1_scalar_get_b32(&sig64[32], &session_i.s_part);
    memcpy(&sig64[0], session_i.fin_nonce, 32);
    return 1;
}